

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_rmw(int comex_op,void *ploc,void *prem,int extra,int proc,comex_group_t group)

{
  int iVar1;
  char *pcVar2;
  undefined4 *puVar3;
  ulong size_00;
  undefined8 in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  int world_proc;
  int ierr;
  int size;
  long extra_long;
  op_t op;
  int length;
  char *message;
  char *payload;
  char *notify;
  header_t *header;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa4;
  undefined4 local_50;
  undefined4 local_4c;
  
  iVar1 = comex_group_size(in_stack_ffffffffffffffa4,
                           (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar1 != 0) {
    __assert_fail("COMEX_SUCCESS == ierr",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x69a,"int comex_rmw(int, void *, void *, int, int, comex_group_t)");
  }
  if (in_R8D < 0) {
    __assert_fail("proc >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x69a,"int comex_rmw(int, void *, void *, int, int, comex_group_t)");
  }
  if (in_stack_ffffffffffffffa4 <= in_R8D) {
    __assert_fail("proc < size",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x69a,"int comex_rmw(int, void *, void *, int, int, comex_group_t)");
  }
  if (in_R9D != 0) {
    comex_group_translate_world
              (in_stack_ffffffffffffffa4,0,
               (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  size_00 = (ulong)(in_EDI - 10);
  switch(size_00) {
  case 0:
    local_50 = 0xf;
    local_4c = 4;
    _my_malloc(size_00);
    _my_memcpy((void *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),
               (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),size_00);
    break;
  case 1:
    local_50 = 0xf;
    local_4c = 8;
    _my_malloc(size_00);
    _my_memcpy((void *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),
               (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),size_00);
    break;
  case 2:
    local_50 = 0xd;
    local_4c = 4;
    _my_malloc(size_00);
    _my_memcpy((void *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),
               (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),size_00);
    break;
  case 3:
    local_50 = 0xd;
    local_4c = 8;
    _my_malloc(size_00);
    _my_memcpy((void *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),
               (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),size_00);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x6b9,"int comex_rmw(int, void *, void *, int, int, comex_group_t)");
  }
  pcVar2 = (char *)_my_malloc(size_00);
  puVar3 = (undefined4 *)_my_malloc(size_00);
  if (puVar3 == (undefined4 *)0x0) {
    __assert_fail("header",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x6c0,"int comex_rmw(int, void *, void *, int, int, comex_group_t)");
  }
  *puVar3 = local_50;
  *(undefined8 *)(puVar3 + 2) = in_RDX;
  *(undefined8 *)(puVar3 + 4) = in_RSI;
  puVar3[6] = local_4c;
  *(char **)(puVar3 + 8) = pcVar2;
  *pcVar2 = '\x01';
  _my_malloc(size_00);
  _my_memcpy((void *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),
             (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),size_00);
  _my_memcpy((void *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),
             (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),size_00);
  _mq_push(in_stack_ffffffffffffffa4,
           (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
           (int)(size_00 >> 0x20));
  while ('\0' < *pcVar2) {
    comex_make_progress();
  }
  _my_free((void *)0x110a0b);
  _my_free((void *)0x110a15);
  _my_free((void *)0x110a1f);
  return 0;
}

Assistant:

int comex_rmw(
        int comex_op, void *ploc, void *prem, int extra,
        int proc, comex_group_t group)
{
    header_t *header = NULL;
    char *notify = NULL;
    char *payload = NULL;
    char *message = NULL;
    int length = 0;
    op_t op;
    long extra_long = (long)extra;

    CHECK_GROUP(group,proc);
#if DEBUG
    printf("[%d] comex_rmw(%d, %p, %p, %d, %d)\n",
            l_state.rank, comex_op, ploc, prem, extra, proc);
#endif

    switch (comex_op) {
        case COMEX_FETCH_AND_ADD:
            op = OP_FETCH_AND_ADD_REQUEST;
            length = sizeof(int);
            payload = _my_malloc(length);
            _my_memcpy(payload, &extra, length);
            break;
        case COMEX_FETCH_AND_ADD_LONG:
            op = OP_FETCH_AND_ADD_REQUEST;
            length = sizeof(long);
            payload = _my_malloc(length);
            _my_memcpy(payload, &extra_long, length);
            break;
        case COMEX_SWAP:
            op = OP_SWAP_REQUEST;
            length = sizeof(int);
            payload = _my_malloc(length);
            _my_memcpy(payload, ploc, length);
            break;
        case COMEX_SWAP_LONG:
            op = OP_SWAP_REQUEST;
            length = sizeof(long);
            payload = _my_malloc(length);
            _my_memcpy(payload, ploc, length);
            break;
        default: assert(0);
    }

    notify = _my_malloc(sizeof(char));

    /* create and prepare the header */
    header = _my_malloc(sizeof(header_t));
    assert(header);
    header->operation = op;
    header->remote_address = prem;
    header->local_address = ploc;
    header->length = length;
    header->notify_address = notify;

    /* set the value to wait on for a rmw response */
    *notify = 1;

    message = _my_malloc(sizeof(header_t) + length);
    _my_memcpy(message, header, sizeof(header_t));
    _my_memcpy(message+sizeof(header_t), payload, length);

    _mq_push(proc, (char*)message, sizeof(header_t)+length);
    
    while (*notify > 0) {
        comex_make_progress();
#if DEBUG
        printf("[%d] are we stuck? rmw notify=%d\n",
                l_state.rank, (int)*notify);
#endif
    }

    _my_free(notify);
    _my_free(payload);
    _my_free(header);

    return COMEX_SUCCESS;
}